

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UI.cpp
# Opt level: O3

void __thiscall
UI::showDeliveryPath
          (UI *this,vector<int,_std::allocator<int>_> *path,vector<int,_std::allocator<int>_> *POIs)

{
  int *piVar1;
  pointer piVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int y;
  GraphViewer *pGVar6;
  Vertex<std::pair<double,_double>_> *pVVar7;
  uint poi_n;
  ulong uVar8;
  long lVar9;
  pointer piVar10;
  ulong uVar11;
  int id;
  ulong uVar12;
  pair<double,_double> pVar13;
  string local_50;
  
  pGVar6 = (GraphViewer *)operator_new(0x18);
  GraphViewer::GraphViewer(pGVar6,this->gv_width,this->gv_height,false);
  this->gv = pGVar6;
  GraphViewer::defineEdgeCurved(pGVar6,false);
  GraphViewer::defineVertexSize(this->gv,3);
  GraphViewer::createWindow(this->gv,this->gv_width,this->gv_height);
  piVar1 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish == piVar1) {
LAB_001144ee:
    uVar11 = 0;
    uVar8 = 0;
LAB_001144e7:
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar11,
               uVar8);
  }
  piVar10 = (POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  piVar2 = (POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  pVVar7 = Graph<std::pair<double,_double>_>::findVertex(this->graph,piVar1);
  pGVar6 = this->gv;
  pVar13 = Vertex<std::pair<double,_double>_>::getInfo(pVVar7);
  iVar4 = x_fitted(this,pVar13.first);
  pVar13 = Vertex<std::pair<double,_double>_>::getInfo(pVVar7);
  iVar5 = y_fitted(this,pVar13.second);
  GraphViewer::addNode(pGVar6,0,iVar4,iVar5);
  if (piVar10 == piVar2) {
    poi_n = 0xffffffff;
  }
  else {
    iVar4 = Vertex<std::pair<double,_double>_>::getId(pVVar7);
    piVar1 = (POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish == piVar1) goto LAB_001144ee;
    poi_n = 0;
    if (iVar4 == *piVar1) {
      setPOIProperties(this,pVVar7,0,0);
      poi_n = -(uint)((ulong)((long)(POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start) < 5) | 1;
    }
  }
  piVar10 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start;
  if (4 < (ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar10)) {
    uVar12 = 1;
    lVar9 = 4;
    iVar4 = 0;
    do {
      pVVar7 = Graph<std::pair<double,_double>_>::findVertex
                         (this->graph,(int *)((long)piVar10 + lVar9));
      pGVar6 = this->gv;
      pVar13 = Vertex<std::pair<double,_double>_>::getInfo(pVVar7);
      iVar5 = x_fitted(this,pVar13.first);
      pVar13 = Vertex<std::pair<double,_double>_>::getInfo(pVVar7);
      y = y_fitted(this,pVar13.second);
      id = (int)uVar12;
      GraphViewer::addNode(pGVar6,id,iVar5,y);
      uVar3 = 0xffffffff;
      if (poi_n != 0xffffffff) {
        iVar5 = Vertex<std::pair<double,_double>_>::getId(pVVar7);
        uVar11 = (ulong)(int)poi_n;
        piVar10 = (POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar8 = (long)(POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)piVar10 >> 2;
        if (uVar8 <= uVar11) goto LAB_001144e7;
        uVar3 = poi_n;
        if (iVar5 == piVar10[uVar11]) {
          setPOIProperties(this,pVVar7,id,poi_n);
          uVar3 = poi_n + 1;
          if ((ulong)((long)(POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(POIs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2) <= (ulong)(long)(int)(poi_n + 1))
          {
            uVar3 = 0xffffffff;
          }
        }
      }
      poi_n = uVar3;
      GraphViewer::addEdge(this->gv,id,iVar4,id,1);
      uVar12 = uVar12 + 1;
      piVar10 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar4 = iVar4 + 1;
      lVar9 = lVar9 + 4;
    } while (uVar12 < (ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar10 >> 2));
  }
  GraphViewer::rearrange(this->gv);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ENTER to go back","");
  enterWait(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  operator_delete(this->gv,0x18);
  return;
}

Assistant:

void UI::showDeliveryPath(vector<int> path, vector<int> POIs) {
    this->gv = new GraphViewer(gv_width, gv_height, false);
    gv->defineEdgeCurved(false);
    gv->defineVertexSize(3);
    gv->createWindow(gv_width, gv_height);
    int current_POI = -1;

    if (!POIs.empty()) {
        current_POI = 0;
    }

    Vertex<coordinates> *a = graph->findVertex(path.at(0));
    gv->addNode(0, x_fitted(a->getInfo().first), y_fitted(a->getInfo().second));
    if (current_POI != -1 && a->getId() == POIs.at(current_POI)) {
        setPOIProperties(a, 0, current_POI);
        if (++current_POI >= POIs.size()) { current_POI = -1; }
    }

    for (int i = 1; i < path.size(); i++) {
        a = graph->findVertex(path.at(i));

        gv->addNode(i, x_fitted(a->getInfo().first), y_fitted(a->getInfo().second));
        if (current_POI != -1 && a->getId() == POIs.at(current_POI)) {
            setPOIProperties(a, i, current_POI);
            if (++current_POI >= POIs.size()) { current_POI = -1; }
        }
        gv->addEdge(i, i-1, i, EdgeType::DIRECTED);
    }

    gv->rearrange();

    enterWait();
    delete gv;
}